

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes__compute_welded_normals(par_shapes_mesh *m)

{
  float epsilon_00;
  float *pfVar1;
  uint16_t *weldmap_00;
  par_shapes_mesh *m_00;
  long *in_FS_OFFSET;
  float *pnormal;
  int d;
  int i;
  float *pdst;
  par_shapes_mesh *welded;
  uint16_t *weldmap;
  float epsilon;
  par_shapes_mesh *m_local;
  
  epsilon_00 = par_shapes__epsilon_welded_normals;
  pfVar1 = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  m->normals = pfVar1;
  weldmap_00 = (uint16_t *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  m_00 = par_shapes_weld(m,epsilon_00,weldmap_00);
  par_shapes_compute_normals(m_00);
  _d = m->normals;
  for (pnormal._4_4_ = 0; pnormal._4_4_ < m->npoints; pnormal._4_4_ = pnormal._4_4_ + 1) {
    pfVar1 = m_00->normals + (int)((uint)weldmap_00[pnormal._4_4_] * 3);
    *_d = *pfVar1;
    _d[1] = pfVar1[1];
    _d[2] = pfVar1[2];
    _d = _d + 3;
  }
  (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
  par_shapes_free_mesh(m_00);
  return;
}

Assistant:

PARDEF void par_shapes__compute_welded_normals(par_shapes_mesh* m)
{
    const float epsilon = par_shapes__epsilon_welded_normals;
    m->normals = PAR_MALLOC(float, m->npoints * 3);
    PAR_SHAPES_T* weldmap = PAR_MALLOC(PAR_SHAPES_T, m->npoints);
    par_shapes_mesh* welded = par_shapes_weld(m, epsilon, weldmap);
    par_shapes_compute_normals(welded);
    float* pdst = m->normals;
    for (int i = 0; i < m->npoints; i++, pdst += 3) {
        int d = weldmap[i];
        float const* pnormal = welded->normals + d * 3;
        pdst[0] = pnormal[0];
        pdst[1] = pnormal[1];
        pdst[2] = pnormal[2];
    }
    PAR_FREE(weldmap);
    par_shapes_free_mesh(welded);
}